

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging.c
# Opt level: O2

void oonf_log_cleanup(void)

{
  oonf_log_handler_entry *poVar1;
  long lVar2;
  oonf_log_handler_entry *h;
  
  h = (oonf_log_handler_entry *)_handler_list.next;
  while ((h->_node).prev != _handler_list.prev) {
    poVar1 = (oonf_log_handler_entry *)(h->_node).next;
    oonf_log_removehandler(h);
    h = poVar1;
  }
  for (lVar2 = 6; lVar2 != 0x80; lVar2 = lVar2 + 1) {
    free(LOG_SOURCE_NAMES[lVar2]);
    LOG_SOURCE_NAMES[lVar2] = (char *)0x0;
  }
  abuf_free(&_logbuffer);
  return;
}

Assistant:

void
oonf_log_cleanup(void) {
  struct oonf_log_handler_entry *h, *iterator;
  enum oonf_log_source src;

  /* remove all handlers */
  list_for_each_element_safe(&_handler_list, h, _node, iterator) {
    oonf_log_removehandler(h);
  }

  for (src = LOG_CORESOURCE_COUNT; src < LOG_MAXIMUM_SOURCES; src++) {
    free((void *)LOG_SOURCE_NAMES[src]);
    LOG_SOURCE_NAMES[src] = NULL;
  }
  abuf_free(&_logbuffer);
}